

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_string.cpp
# Opt level: O1

sc_string_old __thiscall sc_dt::operator+(sc_dt *this,char *s,sc_string_old *t)

{
  sc_string_rep *psVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  size_t sVar6;
  sc_string_rep *r;
  size_t sVar7;
  char *__dest;
  int iVar8;
  
  sVar6 = strlen(s);
  r = (sc_string_rep *)operator_new(0x10);
  psVar1 = t->rep;
  sVar7 = strlen(psVar1->str);
  iVar2 = (int)sVar6;
  uVar4 = (int)sVar7 + iVar2;
  uVar3 = (int)sVar7 + iVar2 + 0xf;
  if (-1 < (int)uVar4) {
    uVar3 = uVar4;
  }
  r->ref_count = 1;
  iVar8 = (uVar3 & 0xfffffff0) + 0x10;
  r->alloc = iVar8;
  iVar5 = -1;
  if (-1 < iVar8) {
    iVar5 = iVar8;
  }
  __dest = (char *)operator_new__((long)iVar5);
  r->str = __dest;
  *__dest = '\0';
  strcpy(__dest,s);
  strcpy(__dest + iVar2,psVar1->str);
  sc_string_old::sc_string_old((sc_string_old *)this,r);
  return (sc_string_old)(sc_string_rep *)this;
}

Assistant:

sc_string_old
operator+( const char* s, const sc_string_old& t )
{
    int len = strlen(s);
    sc_string_rep* r = new sc_string_rep( len + t.length() + 1 );
    strcpy( r->str, s );
    strcpy( r->str + len, t );
    return sc_string_old(r);
}